

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dos_blocker.cpp
# Opt level: O2

bool __thiscall
libtorrent::dht::dos_blocker::incoming
          (dos_blocker *this,address *addr,time_point now,dht_logger *logger)

{
  uint32_t uVar1;
  uint32_t uVar2;
  long lVar3;
  undefined8 uVar4;
  address_v4 aVar5;
  address *a1;
  bool bVar6;
  int iVar7;
  int iVar8;
  address *addr_00;
  address *paVar9;
  time_point *ptVar10;
  ulong uVar11;
  string local_50;
  
  paVar9 = &this->m_ban_nodes[0].src;
  ptVar10 = &this->m_ban_nodes[0].limit;
  uVar11 = 8;
  while( true ) {
    if (0x3c7 < uVar11) {
      paVar9[1].ipv6_address_.addr_.__in6_u.__u6_addr32[0] = 1;
      *(long *)(paVar9 + 1) = (long)now.__d.__r + 10000000000;
      aVar5.addr_.s_addr = (addr->ipv4_address_).addr_;
      paVar9->type_ = addr->type_;
      paVar9->ipv4_address_ = (address_v4)aVar5.addr_.s_addr;
      uVar4 = *(undefined8 *)((long)&(addr->ipv6_address_).addr_.__in6_u + 8);
      *(undefined8 *)&(paVar9->ipv6_address_).addr_.__in6_u =
           *(undefined8 *)&(addr->ipv6_address_).addr_.__in6_u;
      *(undefined8 *)((long)&(paVar9->ipv6_address_).addr_.__in6_u + 8) = uVar4;
      (paVar9->ipv6_address_).scope_id_ = (addr->ipv6_address_).scope_id_;
      return true;
    }
    a1 = (address *)((long)this->m_ban_nodes + (uVar11 - 8));
    bVar6 = boost::asio::ip::operator==(a1,addr);
    uVar2 = *(uint32_t *)(ptVar10 + 1);
    if (bVar6) break;
    uVar1 = paVar9[1].ipv6_address_.addr_.__in6_u.__u6_addr32[0];
    if (((int)uVar1 <= (int)uVar2) &&
       ((uVar2 != uVar1 ||
        (lVar3._0_4_ = paVar9[1].type_, lVar3._4_4_ = paVar9[1].ipv4_address_,
        lVar3 <= (ptVar10->__d).__r)))) {
      a1 = paVar9;
    }
    paVar9 = a1;
    uVar11 = uVar11 + 0x30;
    ptVar10 = ptVar10 + 6;
  }
  iVar7 = uVar2 + 1;
  *(int *)(ptVar10 + 1) = iVar7;
  iVar8 = this->m_message_rate_limit * 10;
  if (iVar7 < iVar8) {
    return true;
  }
  if ((long)now.__d.__r < (ptVar10->__d).__r) {
    if (iVar7 == iVar8) {
      if ((logger != (dht_logger *)0x0) &&
         (iVar7 = (**logger->_vptr_dht_logger)(logger,0), (char)iVar7 != '\0')) {
        print_address_abi_cxx11_(&local_50,(libtorrent *)addr,addr_00);
        (*logger->_vptr_dht_logger[1])
                  (logger,0,"BANNING PEER [ ip: %s time: %d ms count: %d ]",
                   local_50._M_dataplus._M_p,
                   (((long)now.__d.__r + 10000000000) - (ptVar10->__d).__r) / 1000000 & 0xffffffff,
                   (ulong)*(uint *)(ptVar10 + 1));
        std::__cxx11::string::~string((string *)&local_50);
      }
      (ptVar10->__d).__r = (long)this->m_block_timeout * 1000000000 + (long)now.__d.__r;
    }
    return false;
  }
  *(int *)(ptVar10 + 1) = 0;
  (ptVar10->__d).__r = (long)now.__d.__r + 10000000000;
  return true;
}

Assistant:

bool dos_blocker::incoming(address const& addr, time_point const now, dht_logger* logger)
	{
		TORRENT_UNUSED(logger);
		node_ban_entry* match = nullptr;
		node_ban_entry* min = m_ban_nodes;
		for (node_ban_entry* i = m_ban_nodes; i < m_ban_nodes + num_ban_nodes; ++i)
		{
			if (i->src == addr)
			{
				match = i;
				break;
			}
			if (i->count < min->count) min = i;
			else if (i->count == min->count
				&& i->limit < min->limit) min = i;
		}

		if (match)
		{
			++match->count;

			if (match->count >= m_message_rate_limit * 10)
			{
				if (now < match->limit)
				{
					if (match->count == m_message_rate_limit * 10)
					{
#ifndef TORRENT_DISABLE_LOGGING
						if (logger != nullptr && logger->should_log(dht_logger::tracker))
						{
							logger->log(dht_logger::tracker, "BANNING PEER [ ip: %s time: %d ms count: %d ]"
								, print_address(addr).c_str()
								, int(total_milliseconds((now - match->limit) + seconds(10)))
								, match->count);
						}
#else
						TORRENT_UNUSED(logger);
#endif // TORRENT_DISABLE_LOGGING
						// we've received too many messages in less than 10 seconds
						// from this node. Ignore it until it's silent for 5 minutes
						match->limit = now + seconds(m_block_timeout);
					}

					return false;
				}

				// the messages we received from this peer took more than 10
				// seconds. Reset the counter and the timer
				match->count = 0;
				match->limit = now + seconds(10);
			}
		}
		else
		{
			min->count = 1;
			min->limit = now + seconds(10);
			min->src = addr;
		}
		return true;
	}